

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SHA1.cpp
# Opt level: O2

bool __thiscall CSHA1::HashFile(CSHA1 *this,char *szFileName)

{
  FILE *__stream;
  ulong uVar1;
  ulong __n;
  ulong uVar2;
  bool bVar3;
  uchar uData [8000];
  
  if (szFileName == (char *)0x0) {
    return false;
  }
  __stream = fopen(szFileName,"rb");
  if (__stream == (FILE *)0x0) {
    bVar3 = false;
  }
  else {
    __n = 0;
    fseek(__stream,0,2);
    uVar1 = ftell(__stream);
    fseek(__stream,0,0);
    uVar2 = 0;
    if (uVar1 != 0) {
      uVar2 = uVar1 / 8000;
      __n = uVar1 % 8000;
    }
    while (bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, bVar3) {
      fread(uData,1,8000,__stream);
      Update(this,uData,8000);
    }
    if (__n != 0) {
      fread(uData,1,__n,__stream);
      Update(this,uData,(uint)__n);
    }
    fclose(__stream);
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool CSHA1::HashFile(char *szFileName)
{
	unsigned long ulFileSize, ulRest, ulBlocks;
	unsigned long i;
	UINT_8 uData[SHA1_MAX_FILE_BUFFER];
	FILE *fIn;

	if(szFileName == NULL) return false;

	fIn = fopen(szFileName, "rb");
	if(fIn == NULL) return false;

	fseek(fIn, 0, SEEK_END);
	ulFileSize = (unsigned long)ftell(fIn);
	fseek(fIn, 0, SEEK_SET);

	if(ulFileSize != 0)
	{
		ulBlocks = ulFileSize / SHA1_MAX_FILE_BUFFER;
		ulRest = ulFileSize % SHA1_MAX_FILE_BUFFER;
	}
	else
	{
		ulBlocks = 0;
		ulRest = 0;
	}

	for(i = 0; i < ulBlocks; i++)
	{
		fread(uData, 1, SHA1_MAX_FILE_BUFFER, fIn);
		Update((UINT_8 *)uData, SHA1_MAX_FILE_BUFFER);
	}

	if(ulRest != 0)
	{
		fread(uData, 1, ulRest, fIn);
		Update((UINT_8 *)uData, ulRest);
	}

	fclose(fIn); fIn = NULL;
	return true;
}